

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmExtraCodeLiteGenerator::CreateProjectsByTarget_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TargetType TVar3;
  char *pcVar4;
  string *psVar5;
  long *plVar6;
  size_type *psVar7;
  pointer ppcVar8;
  string visualname;
  string relafilename;
  string targetName;
  string filename;
  string outputDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  value_type local_c8;
  string local_a8;
  cmExtraCodeLiteGenerator *local_88;
  pointer local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  long local_50;
  long local_48 [2];
  cmGlobalGenerator *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_80 = (local_38->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_d0 = __return_storage_ptr__;
  if (local_80 !=
      (local_38->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_78.field_2;
    local_88 = this;
    do {
      ppcVar8 = ((*local_80)->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppcVar8 !=
          ((*local_80)->GeneratorTargets).
          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          TVar3 = cmGeneratorTarget::GetType(*ppcVar8);
          pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(*local_80);
          std::__cxx11::string::string((string *)&local_58,pcVar4,(allocator *)&local_c8);
          psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar8);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          pcVar2 = (psVar5->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar2,pcVar2 + psVar5->_M_string_length);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_58,local_50 + (long)local_58);
          std::__cxx11::string::append((char *)&local_110);
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_110,(ulong)local_c8._M_dataplus._M_p);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          psVar7 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0.field_2._8_8_ = plVar6[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_f0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          psVar7 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_a8.field_2._M_allocated_capacity = *psVar7;
            local_a8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_a8.field_2._M_allocated_capacity = *psVar7;
            local_a8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_a8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_d0,&local_c8);
          cmSystemTools::RelativePath_abi_cxx11_
                    (&local_f0,(cmSystemTools *)(local_88->WorkspacePath)._M_dataplus._M_p,
                     local_a8._M_dataplus._M_p,(char *)psVar7);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_c8._M_dataplus._M_p,
                     local_c8._M_dataplus._M_p + local_c8._M_string_length);
          if (TVar3 - STATIC_LIBRARY < 3) {
            std::operator+(&local_78,"lib",&local_110);
            std::__cxx11::string::operator=((string *)&local_110,(string *)&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != paVar1) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
LAB_0034882a:
            local_78._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Project","");
            cmXMLWriter::StartElement(xml,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != paVar1) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Name",&local_110);
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Path",&local_f0);
            cmXMLWriter::Attribute<char[3]>(xml,"Active",(char (*) [3])"No");
            cmXMLWriter::EndElement(xml);
            CreateNewProjectFile(local_88,*ppcVar8,&local_a8);
          }
          else if (TVar3 == EXECUTABLE) goto LAB_0034882a;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (local_58 != local_48) {
            operator_delete(local_58,local_48[0] + 1);
          }
          ppcVar8 = ppcVar8 + 1;
        } while (ppcVar8 !=
                 ((*local_80)->GeneratorTargets).
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      local_80 = local_80 + 1;
    } while (local_80 !=
             (local_38->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return local_d0;
}

Assistant:

std::vector<std::string> cmExtraCodeLiteGenerator::CreateProjectsByTarget(
  cmXMLWriter* xml)
{
  std::vector<std::string> retval;
  // for each target in the workspace create a codelite project
  const std::vector<cmLocalGenerator*>& lgs =
    this->GlobalGenerator->GetLocalGenerators();
  for (std::vector<cmLocalGenerator*>::const_iterator lg(lgs.begin());
       lg != lgs.end(); lg++) {
    for (std::vector<cmGeneratorTarget*>::const_iterator lt =
           (*lg)->GetGeneratorTargets().begin();
         lt != (*lg)->GetGeneratorTargets().end(); lt++) {
      cmStateEnums::TargetType type = (*lt)->GetType();
      std::string outputDir = (*lg)->GetCurrentBinaryDirectory();
      std::string targetName = (*lt)->GetName();
      std::string filename = outputDir + "/" + targetName + ".project";
      retval.push_back(targetName);
      // Make the project file relative to the workspace
      std::string relafilename = cmSystemTools::RelativePath(
        this->WorkspacePath.c_str(), filename.c_str());
      std::string visualname = targetName;
      switch (type) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
          visualname = "lib" + visualname;
          CM_FALLTHROUGH;
        case cmStateEnums::EXECUTABLE:
          xml->StartElement("Project");
          xml->Attribute("Name", visualname);
          xml->Attribute("Path", relafilename);
          xml->Attribute("Active", "No");
          xml->EndElement();

          CreateNewProjectFile(*lt, filename);
          break;
        default:
          break;
      }
    }
  }
  return retval;
}